

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void rmult(double *A,double *B,double *C,int m,int n,int p)

{
  ulong uVar1;
  int strA;
  int strB;
  int strC;
  ulong uVar2;
  
  uVar2 = 0;
  uVar1 = (ulong)(uint)(p * m);
  if (p * m < 1) {
    uVar1 = uVar2;
  }
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    C[uVar2] = 0.0;
  }
  recmult(A,B,C,m,n,p,m,n,p);
  return;
}

Assistant:

void rmult(double* A, double* B, double* C,int m,int n, int p) {
	int strA,strB,strC;
	int N;
	register int i;
	strA = m;
	strB = n;
	strC = p;
	N = m * p;
	for(i = 0; i < N; ++i) {
		C[i] = 0.;
	}
	
	recmult(A,B,C,m,n,p,strA,strB,strC);
	
}